

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O3

integer_t tchecker::const_evaluate(expression_t *expr,integer_t value)

{
  integer_t iVar1;
  
  iVar1 = const_evaluate(expr);
  return iVar1;
}

Assistant:

tchecker::integer_t const_evaluate(tchecker::expression_t const & expr, tchecker::integer_t value)
{
  try {
    return const_evaluate(expr);
  }
  catch (std::invalid_argument const & e) {
    return value;
  }
  catch (...) {
    throw;
  }
}